

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O2

void ds_list_destroy(DsList **plist)

{
  DsList *__ptr;
  DsListEntry *pDVar1;
  DsListEntry *__ptr_00;
  DsList *list;
  
  __ptr = *plist;
  if (__ptr != (DsList *)0x0) {
    __ptr_00 = __ptr->entry;
    while (__ptr_00 != (DsListEntry *)0x0) {
      pDVar1 = __ptr_00->next;
      free(__ptr_00);
      __ptr_00 = pDVar1;
    }
    free(__ptr);
    *plist = (DsList *)0x0;
  }
  return;
}

Assistant:

void ds_list_destroy(DsList **plist)
{
    if (*plist)
    {
        DsList *list = *plist;
        DsListEntry *entry = list->entry;
        while (entry)
        {
            DsListEntry *temp = entry;
            entry = entry->next;
            free(temp);
        }
        free(list);
        *plist = NULL;
    }
    return;
}